

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSinglePicFont::FSinglePicFont(FSinglePicFont *this,char *picname)

{
  FTextureID FVar1;
  uint uVar2;
  char *pcVar3;
  FTexture *pFVar4;
  
  (this->super_FFont).Ranges.Array = (FRemapTable *)0x0;
  (this->super_FFont).Ranges.Most = 0;
  (this->super_FFont).Ranges.Count = 0;
  (this->super_FFont).Lump = -1;
  (this->super_FFont).Chars = (CharData *)0x0;
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  (this->super_FFont).Name = (char *)0x0;
  (this->super_FFont).Cursor = '_';
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FFont_007030b8;
  FVar1 = FTextureManager::CheckForTexture(&TexMan,picname,0,1);
  if (FVar1.texnum < 1) {
    I_FatalError("%s is not a font or texture",picname);
  }
  if ((uint)FVar1.texnum < TexMan.Textures.Count) {
    pFVar4 = TexMan.Textures.Array[FVar1.texnum].Texture;
  }
  else {
    pFVar4 = (FTexture *)0x0;
  }
  pcVar3 = copystring(picname);
  (this->super_FFont).Name = pcVar3;
  uVar2 = (uint)((double)((uint)pFVar4->Height * 2) / (pFVar4->Scale).Y);
  (this->super_FFont).FontHeight = (uVar2 & 1) + ((int)uVar2 >> 1);
  uVar2 = (uint)((double)((uint)pFVar4->Width * 2) / (pFVar4->Scale).X);
  (this->super_FFont).SpaceWidth = (uVar2 & 1) + ((int)uVar2 >> 1);
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).FirstChar = 0x41;
  (this->super_FFont).LastChar = 0x41;
  (this->super_FFont).ActiveColors = 0;
  (this->PicNum).texnum = FVar1.texnum;
  (this->super_FFont).Next = FFont::FirstFont;
  FFont::FirstFont = &this->super_FFont;
  return;
}

Assistant:

FSinglePicFont::FSinglePicFont(const char *picname) :
	FFont(-1) // Since lump is only needed for priority information we don't need to worry about this here.
{
	FTextureID picnum = TexMan.CheckForTexture (picname, FTexture::TEX_Any);

	if (!picnum.isValid())
	{
		I_FatalError ("%s is not a font or texture", picname);
	}

	FTexture *pic = TexMan[picnum];

	Name = copystring(picname);
	FontHeight = pic->GetScaledHeight();
	SpaceWidth = pic->GetScaledWidth();
	GlobalKerning = 0;
	FirstChar = LastChar = 'A';
	ActiveColors = 0;
	PicNum = picnum;

	Next = FirstFont;
	FirstFont = this;
}